

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O1

void IndexWaitSynced(BaseIndex *index,SignalInterrupt *interrupt)

{
  bool bVar1;
  long in_FS_OFFSET;
  IndexSummary local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = BaseIndex::BlockUntilSyncedToCurrentChain(index);
  if (!bVar1) {
    do {
      bVar1 = util::SignalInterrupt::operator_cast_to_bool(interrupt);
      local_80.name._M_dataplus._M_p._0_1_ = !bVar1;
      inline_assertion_check<true,bool>
                ((bool *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/index.cpp"
                 ,0x11,"IndexWaitSynced","!interrupt");
      local_80.name._M_dataplus._M_p = (pointer)0x186a0;
      UninterruptibleSleep((microseconds *)&local_80);
      bVar1 = BaseIndex::BlockUntilSyncedToCurrentChain(index);
    } while (!bVar1);
  }
  BaseIndex::GetSummary(&local_80,index);
  if (local_80.synced != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.name._M_dataplus._M_p != &local_80.name.field_2) {
      operator_delete(local_80.name._M_dataplus._M_p,local_80.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("index.GetSummary().synced",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/index.cpp"
                ,0x15,"void IndexWaitSynced(const BaseIndex &, const util::SignalInterrupt &)");
}

Assistant:

void IndexWaitSynced(const BaseIndex& index, const util::SignalInterrupt& interrupt)
{
    while (!index.BlockUntilSyncedToCurrentChain()) {
        // Assert shutdown was not requested to abort the test, instead of looping forever, in case
        // there was an unexpected error in the index that caused it to stop syncing and request a shutdown.
        Assert(!interrupt);

        UninterruptibleSleep(100ms);
    }
    assert(index.GetSummary().synced);
}